

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

void arkStep_ApplyForcing
               (ARKodeARKStepMem step_mem,sunrealtype *stage_times,sunrealtype *stage_coefs,int jmax
               ,int *nvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  sunrealtype *psVar6;
  N_Vector *pp_Var7;
  N_Vector *pp_Var8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  
  psVar6 = step_mem->cvals;
  dVar1 = step_mem->tshift;
  dVar2 = step_mem->tscale;
  uVar4 = step_mem->nforcing;
  pp_Var7 = step_mem->forcing;
  iVar5 = *nvec;
  uVar12 = 0;
  uVar11 = 0;
  if (0 < (int)uVar4) {
    uVar11 = (ulong)uVar4;
  }
  pp_Var8 = step_mem->Xvecs;
  for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    psVar6[(long)iVar5 + uVar12] = 0.0;
    pp_Var8[(long)iVar5 + uVar12] = pp_Var7[uVar12];
  }
  uVar10 = 0;
  uVar12 = (ulong)(uint)jmax;
  if (jmax < 1) {
    uVar12 = uVar10;
  }
  for (; uVar10 != uVar12; uVar10 = uVar10 + 1) {
    dVar3 = stage_times[uVar10];
    dVar13 = 1.0;
    for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      psVar6[(long)iVar5 + uVar9] = dVar13 * stage_coefs[uVar10] + psVar6[(long)iVar5 + uVar9];
      dVar13 = ((dVar3 - dVar1) / dVar2) * dVar13;
    }
  }
  *nvec = iVar5 + uVar4;
  return;
}

Assistant:

void arkStep_ApplyForcing(ARKodeARKStepMem step_mem, sunrealtype* stage_times,
                          sunrealtype* stage_coefs, int jmax, int* nvec)
{
  sunrealtype tau, taui;
  int j, k;

  /* Shortcuts to step_mem data */
  sunrealtype* vals  = step_mem->cvals;
  N_Vector* vecs     = step_mem->Xvecs;
  sunrealtype tshift = step_mem->tshift;
  sunrealtype tscale = step_mem->tscale;
  int nforcing       = step_mem->nforcing;
  N_Vector* forcing  = step_mem->forcing;

  /* Offset into vals and vecs arrays */
  int offset = *nvec;

  /* Initialize scaling values, set vectors */
  for (k = 0; k < nforcing; k++)
  {
    vals[offset + k] = ZERO;
    vecs[offset + k] = forcing[k];
  }

  for (j = 0; j < jmax; j++)
  {
    tau  = (stage_times[j] - tshift) / tscale;
    taui = ONE;

    for (k = 0; k < nforcing; k++)
    {
      vals[offset + k] += stage_coefs[j] * taui;
      taui *= tau;
    }
  }

  /* Update vector count for linear combination */
  *nvec += nforcing;
}